

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDIS.cpp
# Opt level: O2

int main(void)

{
  KUINT16 KVar1;
  ostream *poVar2;
  int iVar3;
  bool bVar4;
  Bundle pduBundle;
  KRef_Ptr<KDIS::PDU::Header7> local_278;
  KDataStream local_260;
  Entity_State_PDU local_238;
  Connection myConnection;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"192.168.3.255",(allocator<char> *)&pduBundle);
  KDIS::NETWORK::Connection::Connection
            (&myConnection,(KString *)&local_238,3000,false,true,(PDU_Factory *)0x0,false);
  std::__cxx11::string::~string((string *)&local_238);
  KDIS::PDU::Bundle::Bundle(&pduBundle);
  iVar3 = 10;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    EntityGenerator::GenerateEntity();
    KDIS::PDU::Entity_State_PDU::Encode(&local_260,&local_238);
    KDIS::PDU::Bundle::AddPDU(&pduBundle,&local_260);
    KDIS::KDataStream::~KDataStream(&local_260);
    KDIS::PDU::Entity_State_PDU::~Entity_State_PDU(&local_238);
  }
  KDIS::PDU::Bundle::Encode((KDataStream *)&local_238,&pduBundle);
  KDIS::NETWORK::Connection::Send(&myConnection,(KDataStream *)&local_238);
  KDIS::KDataStream::~KDataStream((KDataStream *)&local_238);
  poVar2 = std::operator<<((ostream *)&std::cout,"1: Sent Bundle, Size: ");
  KVar1 = KDIS::PDU::Bundle::GetLength(&pduBundle);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,KVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  KDIS::PDU::Bundle::ClearPDUs(&pduBundle);
  iVar3 = 10;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    EntityGenerator::GenerateEntityRef();
    KDIS::PDU::Bundle::AddPDU(&pduBundle,&local_278);
    KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>::~KRef_Ptr(&local_278);
  }
  KDIS::PDU::Bundle::Encode((KDataStream *)&local_238,&pduBundle);
  KDIS::NETWORK::Connection::Send(&myConnection,(KDataStream *)&local_238);
  KDIS::KDataStream::~KDataStream((KDataStream *)&local_238);
  poVar2 = std::operator<<((ostream *)&std::cout,"2: Sent Bundle, Size: ");
  KVar1 = KDIS::PDU::Bundle::GetLength(&pduBundle);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,KVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  KDIS::PDU::Bundle::~Bundle(&pduBundle);
  KDIS::NETWORK::Connection::~Connection(&myConnection);
  return 0;
}

Assistant:

int main()
{
    try
    {
        // Note: This address will probably be different for your network.
        Connection myConnection( "192.168.3.255" );

        // We have 2 ways we can use the Bundle.

        //
        // 1
        // We can give it PDU data streams and it will concatenate them for us into a single packet.

        // Create the bundle. Just a collection of random ESPDUs.
        Bundle pduBundle;
        for( int i = 0; i < PDU_COUNT; ++i )
        {
            pduBundle.AddPDU( EntityGenerator::GenerateEntity().Encode() );
        }

        // Now send the bundle
        myConnection.Send( pduBundle.Encode() );
        cout << "1: Sent Bundle, Size: " << pduBundle.GetLength() << endl;

        //
        // 2
        // We can give it PDU pointers/references which will be encoded each time.
        // We can then use this over time if we want to keep sending the PDU together.
        pduBundle.ClearPDUs();

        for( int i = 0; i < PDU_COUNT; ++i )
        {
            pduBundle.AddPDU( EntityGenerator::GenerateEntityRef() );
        }

        // Now send the bundle
        myConnection.Send( pduBundle.Encode() );

        cout << "2: Sent Bundle, Size: " << pduBundle.GetLength() << endl;
    }
    catch( exception & e )
    {
        cout << e.what() << endl;
    }

    return 0;
}